

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,Expr *pOn,IdList *pUsing)

{
  int iVar1;
  sqlite3 *db;
  uint uVar2;
  undefined4 uVar3;
  SrcList *pSVar4;
  RenameToken *pRVar5;
  char *pcVar6;
  
  db = pParse->db;
  if (p == (SrcList *)0x0) {
    if (pOn != (Expr *)0x0 || pUsing != (IdList *)0x0) {
      pcVar6 = "USING";
      if (pOn != (Expr *)0x0) {
        pcVar6 = "ON";
      }
      sqlite3ErrorMsg(pParse,"a JOIN clause is required before %s",pcVar6);
      goto LAB_0016027c;
    }
    p = (SrcList *)0x0;
  }
  pSVar4 = sqlite3SrcListAppend(pParse,p,pTable,pDatabase);
  if (pSVar4 != (SrcList *)0x0) {
    iVar1 = pSVar4->nSrc;
    if ((1 < pParse->eParseMode) &&
       (pcVar6 = pSVar4->a[(long)iVar1 + -1].zName, pcVar6 != (char *)0x0)) {
      if ((pDatabase == (Token *)0x0) || (pDatabase->z == (char *)0x0)) {
        pDatabase = pTable;
      }
      pRVar5 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
      if (pRVar5 != (RenameToken *)0x0) {
        pRVar5->p = pcVar6;
        uVar2 = pDatabase->n;
        uVar3 = *(undefined4 *)&pDatabase->field_0xc;
        (pRVar5->t).z = pDatabase->z;
        (pRVar5->t).n = uVar2;
        *(undefined4 *)&(pRVar5->t).field_0xc = uVar3;
        pRVar5->pNext = pParse->pRename;
        pParse->pRename = pRVar5;
      }
    }
    if (pAlias->n != 0) {
      pcVar6 = sqlite3NameFromToken(db,pAlias);
      pSVar4->a[(long)iVar1 + -1].zAlias = pcVar6;
    }
    pSVar4->a[(long)iVar1 + -1].pSelect = pSubquery;
    pSVar4->a[(long)iVar1 + -1].pOn = pOn;
    pSVar4->a[(long)iVar1 + -1].pUsing = pUsing;
    return pSVar4;
  }
LAB_0016027c:
  if (pOn != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,pOn);
  }
  sqlite3IdListDelete(db,pUsing);
  if (pSubquery != (Select *)0x0) {
    clearSelect(db,pSubquery,1);
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  Expr *pOn,              /* The ON clause of a join */
  IdList *pUsing          /* The USING clause of a join */
){
  struct SrcList_item *pItem;
  sqlite3 *db = pParse->db;
  if( !p && (pOn || pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s", 
      (pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(pParse, p, pTable, pDatabase);
  if( p==0 ){
    goto append_from_error;
  }
  assert( p->nSrc>0 );
  pItem = &p->a[p->nSrc-1];
  assert( (pTable==0)==(pDatabase==0) );
  assert( pItem->zName==0 || pDatabase!=0 );
  if( IN_RENAME_OBJECT && pItem->zName ){
    Token *pToken = (ALWAYS(pDatabase) && pDatabase->z) ? pDatabase : pTable;
    sqlite3RenameTokenMap(pParse, pItem->zName, pToken);
  }
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  pItem->pSelect = pSubquery;
  pItem->pOn = pOn;
  pItem->pUsing = pUsing;
  return p;

 append_from_error:
  assert( p==0 );
  sqlite3ExprDelete(db, pOn);
  sqlite3IdListDelete(db, pUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}